

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O2

void stream_obq_remove(nghttp2_stream *stream)

{
  nghttp2_stream *stream_00;
  int iVar1;
  
  if (stream->queued != '\0') {
    do {
      stream_00 = stream->dep_prev;
      if (stream_00 == (nghttp2_stream *)0x0) {
        return;
      }
      nghttp2_pq_remove(&stream_00->obq,&stream->pq_entry);
      if (stream->queued == '\0') {
        __assert_fail("stream->queued",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                      ,0xbf,"void stream_obq_remove(nghttp2_stream *)");
      }
      stream->queued = '\0';
      stream->pending_penalty = 0;
      stream->last_writelen = 0;
      stream->descendant_last_cycle = 0;
      stream->cycle = 0;
      iVar1 = stream_subtree_active(stream_00);
      stream = stream_00;
    } while (iVar1 == 0);
  }
  return;
}

Assistant:

static void stream_obq_remove(nghttp2_stream *stream) {
  nghttp2_stream *dep_stream;

  dep_stream = stream->dep_prev;

  if (!stream->queued) {
    return;
  }

  for (; dep_stream; stream = dep_stream, dep_stream = dep_stream->dep_prev) {
    DEBUGF("stream: remove stream %d from stream %d\n", stream->stream_id,
           dep_stream->stream_id);

    nghttp2_pq_remove(&dep_stream->obq, &stream->pq_entry);

    assert(stream->queued);

    stream->queued = 0;
    stream->cycle = 0;
    stream->pending_penalty = 0;
    stream->descendant_last_cycle = 0;
    stream->last_writelen = 0;

    if (stream_subtree_active(dep_stream)) {
      return;
    }
  }
}